

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O0

char * lws_cmdline_option(int argc,char **argv,char *val)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  int local_34;
  int c;
  size_t n;
  char *val_local;
  char **argv_local;
  char *pcStack_10;
  int argc_local;
  
  sVar3 = strlen(val);
  iVar1 = argc;
  do {
    local_34 = iVar1;
    iVar1 = local_34 + -1;
    if (iVar1 < 1) {
      return (char *)0x0;
    }
    iVar2 = strncmp(argv[iVar1],val,sVar3);
  } while (iVar2 != 0);
  if ((argv[iVar1][sVar3] == '\0') && (iVar1 < argc + -1)) {
    if ((argv[local_34] == (char *)0x0) || (sVar3 = strlen(argv[local_34]), 0x400 < sVar3)) {
      pcStack_10 = (char *)0x0;
    }
    else {
      pcStack_10 = argv[local_34];
    }
  }
  else if (argv[iVar1][sVar3] == '=') {
    pcStack_10 = argv[iVar1] + sVar3 + 1;
  }
  else {
    pcStack_10 = argv[iVar1] + sVar3;
  }
  return pcStack_10;
}

Assistant:

const char *
lws_cmdline_option(int argc, const char **argv, const char *val)
{
	size_t n = strlen(val);
	int c = argc;

	while (--c > 0) {

		if (!strncmp(argv[c], val, n)) {
			if (!*(argv[c] + n) && c < argc - 1) {
				/* coverity treats unchecked argv as "tainted" */
				if (!argv[c + 1] || strlen(argv[c + 1]) > 1024)
					return NULL;
				return argv[c + 1];
			}

			if (argv[c][n] == '=')
				return &argv[c][n + 1];
			return argv[c] + n;
		}
	}

	return NULL;
}